

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O2

int find_column(ParseData *lParse,char *colName,void *itslval)

{
  fitsfile *pfVar1;
  iteratorCol *piVar2;
  int iVar3;
  int iVar4;
  PixelFilter *pPVar5;
  uint uVar6;
  DataInfo *pDVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  int colnum;
  int status;
  iteratorCol *local_d8;
  int typecode;
  long local_c8;
  DataInfo *local_c0;
  fitsfile *local_b8;
  int istatus;
  double tscale;
  double tzero;
  long repeat;
  long width;
  char temp [80];
  
  if (DEBUG_PIXFILTER != 0) {
    printf("find_column(%s)\n");
  }
  if (*colName == '#') {
    iVar3 = find_keywd(lParse,colName + 1,itslval);
    return iVar3;
  }
  pfVar1 = lParse->def_fptr;
  status = 0;
  iVar3 = lParse->nCols;
  lVar9 = (long)iVar3;
  if (lParse->hdutype == 0) {
    pPVar5 = lParse->pixFilter;
    if (pPVar5 == (PixelFilter *)0x0) {
      lParse->status = 0xdb;
      ffpmsg("find_column: IMAGE_HDU but no PixelFilter");
      return -1;
    }
    colnum = -1;
    uVar10 = 0xffffffffffffffff;
    for (uVar8 = 0; (long)uVar8 < (long)pPVar5->count; uVar8 = uVar8 + 1) {
      iVar4 = fits_strcasecmp(colName,pPVar5->tag[uVar8]);
      if (iVar4 == 0) {
        colnum = (int)uVar8;
        uVar10 = uVar8 & 0xffffffff;
      }
      pPVar5 = lParse->pixFilter;
    }
    if ((int)uVar10 < 0) {
      snprintf(temp,0x50,"find_column: PixelFilter tag %s not found",colName);
      ffpmsg(temp);
      lParse->status = 0xdb;
      return -1;
    }
    iVar3 = fits_parser_allocateCol(lParse,iVar3,&lParse->status);
    if (iVar3 != 0) {
      return -1;
    }
    pDVar7 = lParse->varData;
    local_c0 = pDVar7 + lVar9;
    piVar2 = lParse->colData;
    pfVar1 = lParse->pixFilter->ifptr[uVar10 & 0xffffffff];
    local_d8 = (iteratorCol *)pDVar7[lVar9].naxes;
    local_c8 = lVar9;
    ffgipr(pfVar1,5,&typecode,&pDVar7[lVar9].naxis,(long *)local_d8,&status);
    pDVar7 = local_c0;
    *(long *)((long)local_d8 + -0x10) = 1;
    local_d8 = piVar2 + lVar9;
    local_b8 = pfVar1;
    iVar3 = set_image_col_types(lParse,pfVar1,colName,typecode,local_c0,piVar2 + lVar9);
    if (iVar3 != 0) {
      return -1;
    }
    local_d8->fptr = local_b8;
    local_d8->iotype = 0;
    lVar9 = local_c8;
  }
  else {
    if (lParse->compressed == 0) {
      iVar4 = ffgcno(pfVar1,0,colName,&colnum,&status);
      if (iVar4 != 0) {
        if (status == 0xdb) {
          iVar3 = find_keywd(lParse,colName,itslval);
          if (iVar3 == -1) {
            return -1;
          }
          ffcmsg();
          return iVar3;
        }
        goto LAB_0011bda5;
      }
    }
    else {
      colnum = lParse->valCol;
    }
    iVar4 = ffgtcl(pfVar1,colnum,&typecode,&repeat,&width,&status);
    if (iVar4 != 0) {
LAB_0011bda5:
      lParse->status = status;
      return -1;
    }
    iVar3 = fits_parser_allocateCol(lParse,iVar3,&lParse->status);
    if (iVar3 != 0) {
      return -1;
    }
    pDVar7 = lParse->varData + lVar9;
    local_d8 = lParse->colData + lVar9;
    local_b8 = pfVar1;
    fits_iter_set_by_num(local_d8,pfVar1,colnum,0,0);
  }
  strncpy(pDVar7->name,colName,0x50);
  pfVar1 = local_b8;
  pDVar7->name[0x50] = '\0';
  iVar3 = lParse->hdutype;
  if (iVar3 == 0) {
    iVar4 = 0x10e;
    goto LAB_0011c219;
  }
  uVar6 = typecode - 0x15;
  if (uVar6 < 0x3e) {
    if ((0x3000000000200000U >> ((ulong)uVar6 & 0x3f) & 1) == 0) {
      if ((0x100001UL >> ((ulong)uVar6 & 0x3f) & 1) == 0) goto LAB_0011c062;
LAB_0011c0a4:
      local_c8 = lVar9;
      local_c0 = pDVar7;
      snprintf(temp,0x50,"TZERO%d",(ulong)(uint)colnum);
      istatus = 0;
      iVar3 = ffgky(pfVar1,0x52,temp,&tzero,(char *)0x0,&istatus);
      if (iVar3 != 0) {
        tzero = 0.0;
      }
      snprintf(temp,0x50,"TSCAL%d",(ulong)(uint)colnum);
      istatus = 0;
      iVar3 = ffgky(pfVar1,0x52,temp,&tscale,(char *)0x0,&istatus);
      pDVar7 = local_c0;
      lVar9 = local_c8;
      if (iVar3 == 0) {
        if ((tscale == 1.0) && (!NAN(tscale))) goto LAB_0011c178;
LAB_0011c196:
        local_c0->type = 0x104;
        goto LAB_0011c19e;
      }
      tscale = 1.0;
LAB_0011c178:
      if (((tzero != 0.0) || (NAN(tzero))) && ((tzero != 32768.0 || (NAN(tzero)))))
      goto LAB_0011c196;
      local_c0->type = 0x103;
      local_d8->datatype = 0x29;
    }
    else {
      pDVar7->type = 0x104;
LAB_0011c19e:
      local_d8->datatype = 0x52;
    }
    iVar4 = 0x10e;
  }
  else {
LAB_0011c062:
    if (typecode == 0x10) {
      pDVar7->type = 0x105;
      local_d8->datatype = 0x10;
      if (0xff < width) {
        snprintf(temp,0x50,"column %d is wider than maximum %d characters",(ulong)(uint)colnum,0xff)
        ;
        ffpmsg(temp);
        lParse->status = 0x1b1;
        return -1;
      }
      iVar4 = 0x110;
      if (iVar3 == 1) {
        repeat = width;
      }
    }
    else {
      if (typecode == 0xb) goto LAB_0011c0a4;
      if (typecode == 0xe) {
        pDVar7->type = 0x102;
        local_d8->datatype = 0xe;
        iVar4 = 0x10f;
      }
      else {
        if (typecode != 1) {
          if (typecode < 0) {
            snprintf(temp,0x50,"variable-length array columns are not supported. typecode = %d");
            ffpmsg(temp);
          }
          lParse->status = 0x1b0;
          return -1;
        }
        pDVar7->type = 0x106;
        local_d8->datatype = 0xb;
        iVar4 = 0x111;
      }
    }
  }
  pDVar7->nelem = repeat;
  local_d8->repeat = 0;
  if ((repeat < 2) || (typecode == 0x10)) {
    pDVar7->naxis = 1;
    pDVar7->naxes[0] = 1;
  }
  else {
    iVar3 = ffgtdm(pfVar1,colnum,5,&pDVar7->naxis,pDVar7->naxes,&status);
    if (iVar3 != 0) {
      lParse->status = status;
      return -1;
    }
  }
LAB_0011c219:
  lParse->nCols = lParse->nCols + 1;
  *(long *)itslval = lVar9;
  return iVar4;
}

Assistant:

static int find_column( ParseData *lParse, char *colName, void *itslval )
{
   FITS_PARSER_YYSTYPE *thelval = (FITS_PARSER_YYSTYPE*)itslval;
   int col_cnt, status;
   int colnum, typecode, type;
   long repeat, width;
   fitsfile *fptr;
   char temp[80];
   double tzero,tscale;
   int istatus;
   DataInfo *varInfo;
   iteratorCol *colIter;

if (DEBUG_PIXFILTER)
   printf("find_column(%s)\n", colName);

   if( *colName == '#' )
     return( find_keywd( lParse, colName + 1, itslval ) );

   fptr = lParse->def_fptr;

   status = 0;
   col_cnt = lParse->nCols;

if (lParse->hdutype == IMAGE_HDU) {
   int i;
   if (!lParse->pixFilter) {
      lParse->status = COL_NOT_FOUND;
      ffpmsg("find_column: IMAGE_HDU but no PixelFilter");
      return pERROR;
   }

   colnum = -1;
   for (i = 0; i < lParse->pixFilter->count; ++i) {
      if (!fits_strcasecmp(colName, lParse->pixFilter->tag[i]))
         colnum = i;
   }
   if (colnum < 0) {
      snprintf(temp, 80, "find_column: PixelFilter tag %s not found", colName);
      ffpmsg(temp);
      lParse->status = COL_NOT_FOUND;
      return pERROR;
   }

   if( fits_parser_allocateCol( lParse, col_cnt, &lParse->status ) ) return pERROR;

   varInfo = lParse->varData + col_cnt;
   colIter = lParse->colData + col_cnt;

   fptr = lParse->pixFilter->ifptr[colnum];
   fits_get_img_param(fptr,
                MAXDIMS,
                &typecode, /* actually bitpix */
                &varInfo->naxis,
                &varInfo->naxes[0],
                &status);
   varInfo->nelem = 1;
   type = COLUMN;
   if (set_image_col_types(lParse, fptr, colName, typecode, varInfo, colIter))
      return pERROR;
   colIter->fptr = fptr;
   colIter->iotype = InputCol;
}
else { /* HDU holds a table */
   if( lParse->compressed )
      colnum = lParse->valCol;
   else
      if( fits_get_colnum( fptr, CASEINSEN, colName, &colnum, &status ) ) {
         if( status == COL_NOT_FOUND ) {
	   type = find_keywd( lParse, colName, itslval );
            if( type != pERROR ) ffcmsg();
            return( type );
         }
         lParse->status = status;
         return pERROR;
      }
   
   if( fits_get_coltype( fptr, colnum, &typecode,
                         &repeat, &width, &status ) ) {
      lParse->status = status;
      return pERROR;
   }

   if( fits_parser_allocateCol( lParse, col_cnt, &lParse->status ) ) return pERROR;

   varInfo = lParse->varData + col_cnt;
   colIter = lParse->colData + col_cnt;

   fits_iter_set_by_num( colIter, fptr, colnum, 0, InputCol );
}

   /*  Make sure we don't overflow variable name array  */
   strncpy(varInfo->name,colName,MAXVARNAME);
   varInfo->name[MAXVARNAME] = '\0';

if (lParse->hdutype != IMAGE_HDU) {
   switch( typecode ) {
   case TBIT:
      varInfo->type     = BITSTR;
      colIter->datatype = TBYTE;
      type = BITCOL;
      break;
   case TBYTE:
   case TSHORT:
   case TLONG:
      /* The datatype of column with TZERO and TSCALE keywords might be 
         float or double. 
      */
      snprintf(temp,80,"TZERO%d",colnum);
      istatus = 0;
      if(fits_read_key(fptr,TDOUBLE,temp,&tzero,NULL,&istatus)) {
          tzero = 0.0;
      } 
      snprintf(temp,80,"TSCAL%d",colnum);
      istatus = 0;
      if(fits_read_key(fptr,TDOUBLE,temp,&tscale,NULL,&istatus)) {
          tscale = 1.0;
      } 
      if (tscale == 1.0 && (tzero == 0.0 || tzero == 32768.0 )) {
          varInfo->type     = LONG;
          colIter->datatype = TLONG;
/*    Reading an unsigned long column as a long can cause overflow errors.
      Treat the column as a double instead.
      } else if (tscale == 1.0 &&  tzero == 2147483648.0 ) {
          varInfo->type     = LONG;
          colIter->datatype = TULONG;
 */

      }
      else {
          varInfo->type     = DOUBLE;
          colIter->datatype = TDOUBLE;
      }
      type = COLUMN;
      break;
/* 
  For now, treat 8-byte integer columns as type double.
  This can lose precision, so the better long term solution
  will be to add support for TLONGLONG as a separate datatype.
*/
   case TLONGLONG:
   case TFLOAT:
   case TDOUBLE:
      varInfo->type     = DOUBLE;
      colIter->datatype = TDOUBLE;
      type = COLUMN;
      break;
   case TLOGICAL:
      varInfo->type     = BOOLEAN;
      colIter->datatype = TLOGICAL;
      type = BCOLUMN;
      break;
   case TSTRING:
      varInfo->type     = STRING;
      colIter->datatype = TSTRING;
      type = SCOLUMN;
      if ( width >= MAX_STRLEN ) {
	snprintf(temp, 80, "column %d is wider than maximum %d characters",
		colnum, MAX_STRLEN-1);
        ffpmsg(temp);
	lParse->status = PARSE_LRG_VECTOR;
	return pERROR;
      }
      if( lParse->hdutype == ASCII_TBL ) repeat = width;
      break;
   default:
      if (typecode < 0) {
        snprintf(temp, 80,"variable-length array columns are not supported. typecode = %d", typecode);
        ffpmsg(temp);
      }
      lParse->status = PARSE_BAD_TYPE;
      return pERROR;
   }
   varInfo->nelem = repeat;
   colIter->repeat = 0; /* ffiter() will fill in this value */
   if( repeat>1 && typecode!=TSTRING ) {
      if( fits_read_tdim( fptr, colnum, MAXDIMS,
                          &varInfo->naxis,
                          &varInfo->naxes[0], &status )
          ) {
         lParse->status = status;
         return pERROR;
      }
   } else {
      varInfo->naxis = 1;
      varInfo->naxes[0] = 1;
   }
}
   lParse->nCols++;
   thelval->lng = col_cnt;

   return( type );
}